

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall chrono::robosimian::RoboSimian::Translate(RoboSimian *this,ChVector<double> *shift)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  element_type *peVar4;
  
  peVar3 = (((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar1 = shift->m_data[2];
  dVar2 = shift->m_data[1];
  *(double *)(peVar3 + 0x80) = *(double *)(peVar3 + 0x80) + shift->m_data[0];
  *(double *)(peVar3 + 0x88) = *(double *)(peVar3 + 0x88) + dVar2;
  *(double *)(peVar3 + 0x90) = *(double *)(peVar3 + 0x90) + dVar1;
  peVar4 = (this->m_sled).
           super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    peVar3 = (peVar4->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = shift->m_data[2];
    dVar2 = shift->m_data[1];
    *(double *)(peVar3 + 0x80) = *(double *)(peVar3 + 0x80) + shift->m_data[0];
    *(double *)(peVar3 + 0x88) = *(double *)(peVar3 + 0x88) + dVar2;
    *(double *)(peVar3 + 0x90) = *(double *)(peVar3 + 0x90) + dVar1;
  }
  RS_Limb::Translate((((this->m_limbs).
                       super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  RS_Limb::Translate((this->m_limbs).
                     super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].
                     super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,shift);
  return;
}

Assistant:

void RoboSimian::Translate(const ChVector<>& shift) {
    m_chassis->Translate(shift);
    if (m_sled)
        m_sled->Translate(shift);
    m_limbs[FR]->Translate(shift);
    m_limbs[RR]->Translate(shift);
    m_limbs[RL]->Translate(shift);
    m_limbs[FL]->Translate(shift);
}